

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

int __thiscall gvr::Mesh::getUsedVertices(Mesh *this,vector<bool,_std::allocator<bool>_> *vused)

{
  ulong *puVar1;
  int iVar2;
  byte bVar3;
  difference_type __n;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar14;
  undefined1 auVar13 [16];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar19;
  uint uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  
  std::vector<bool,_std::allocator<bool>_>::resize(vused,(long)(this->super_PointCloud).n,false);
  iVar10 = (this->super_PointCloud).n;
  uVar5 = (ulong)iVar10;
  if (0 < (long)uVar5) {
    lVar6 = *(long *)vused;
    uVar4 = 0;
    do {
      bVar3 = (byte)uVar4 & 0x3f;
      puVar1 = (ulong *)(lVar6 + (uVar4 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  iVar2 = this->n;
  if (0 < iVar2) {
    lVar6 = *(long *)vused;
    iVar7 = iVar2 * 3 + 1;
    puVar8 = this->triangle + (iVar2 * 3 - 1);
    do {
      puVar1 = (ulong *)(lVar6 + (ulong)(*puVar8 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)*puVar8 & 0x3f);
      iVar7 = iVar7 + -1;
      puVar8 = puVar8 + -1;
    } while (1 < iVar7);
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  else {
    lVar6 = uVar5 - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_001286a0;
    auVar11 = _DAT_00128690;
    uVar17 = 0;
    uVar20 = 0;
    do {
      uVar19 = uVar20;
      uVar16 = uVar17;
      auVar13 = auVar11 ^ _DAT_001286a0;
      auVar12._0_4_ = -(uint)(auVar9._0_4_ < auVar13._0_4_);
      auVar12._4_4_ = -(uint)(auVar9._4_4_ < auVar13._4_4_);
      auVar12._8_4_ = -(uint)(auVar9._8_4_ < auVar13._8_4_);
      auVar12._12_4_ = -(uint)(auVar9._12_4_ < auVar13._12_4_);
      uVar14 = -(uint)(auVar13._4_4_ == auVar9._4_4_);
      uVar15 = -(uint)(auVar13._12_4_ == auVar9._12_4_);
      auVar13._4_4_ = uVar14;
      auVar13._0_4_ = uVar14;
      auVar13._8_4_ = uVar15;
      auVar13._12_4_ = uVar15;
      auVar18 = auVar13 & auVar12;
      auVar21._4_4_ = auVar12._4_4_;
      auVar21._0_4_ = auVar12._4_4_;
      auVar21._8_4_ = auVar12._12_4_;
      auVar21._12_4_ = auVar12._12_4_;
      auVar21 = auVar21 | auVar18;
      if ((~auVar21._0_4_ & 1) != 0) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(*(long *)vused + (uVar5 >> 6) * 8);
      }
      if (((auVar21._8_2_ ^ 0xffff) & 1) != 0) {
        auVar18._8_8_ = *(undefined8 *)(*(long *)vused + (uVar5 >> 6) * 8);
      }
      auVar13 = auVar11 & _DAT_001289f0;
      auVar22._8_4_ = auVar13._8_4_;
      auVar22._12_4_ = auVar13._12_4_;
      auVar22._0_8_ = auVar13._8_8_;
      uVar4 = 1L << auVar13._0_8_ & auVar18._0_8_;
      uVar23 = 1L << auVar22._8_8_ & auVar18._8_8_;
      uVar17 = (uVar16 - ((int)uVar4 == 0 && (int)(uVar4 >> 0x20) == 0)) + 1;
      uVar20 = (uVar19 - ((int)uVar23 == 0 && (int)(uVar23 >> 0x20) == 0)) + 1;
      uVar5 = uVar5 + 2;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar6 + 2;
    } while ((iVar10 + 1U & 0xfffffffe) != uVar5);
    uVar14 = auVar12._4_4_ | uVar14 & auVar12._0_4_;
    uVar15 = auVar12._12_4_ | uVar15 & auVar12._8_4_;
    iVar10 = (~uVar15 & uVar20 | uVar19 & uVar15) + (~uVar14 & uVar17 | uVar16 & uVar14);
  }
  return iVar10;
}

Assistant:

int Mesh::getUsedVertices(std::vector<bool> &vused)
{
  vused.resize(getVertexCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=3*getTriangleCount()-1; i>=0; i--)
  {
    vused[triangle[i]]=true;
  }

  int count=0;

  for (int i=0; i<getVertexCount(); i++)
    if (vused[i])
    {
      count++;
    }

  return count;
}